

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86_avx512.cpp
# Opt level: O3

void __thiscall
ncnn::quantize_pack4to1
          (ncnn *this,float *ptr,char *s8ptr0,char *s8ptr1,char *s8ptr2,char *s8ptr3,Mat *scale_data
          ,int elemcount)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  if ((int)scale_data < 2) {
    fVar4 = *(float *)s8ptr3;
    fVar5 = fVar4;
    fVar6 = fVar4;
    fVar7 = fVar4;
  }
  else {
    fVar4 = *(float *)s8ptr3;
    fVar5 = *(float *)(s8ptr3 + 4);
    fVar6 = *(float *)(s8ptr3 + 8);
    fVar7 = *(float *)(s8ptr3 + 0xc);
  }
  uVar1 = 0;
  if (7 < elemcount) {
    uVar1 = elemcount & 0x7ffffff8;
    iVar3 = 7;
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar10._8_4_ = 0x3f000000;
    auVar10._0_8_ = 0x3f0000003f000000;
    auVar10._12_4_ = 0x3f000000;
    auVar12._8_4_ = 0x7f007f;
    auVar12._0_8_ = 0x7f007f007f007f;
    auVar12._12_4_ = 0x7f007f;
    auVar14._8_4_ = 0xff81ff81;
    auVar14._0_8_ = 0xff81ff81ff81ff81;
    auVar14._12_4_ = 0xff81ff81;
    do {
      auVar25._0_4_ = fVar4 * *(float *)this;
      auVar25._4_4_ = fVar5 * *(float *)(this + 4);
      auVar25._8_4_ = fVar6 * *(float *)(this + 8);
      auVar25._12_4_ = fVar7 * *(float *)(this + 0xc);
      auVar20._0_4_ = fVar4 * *(float *)(this + 0x10);
      auVar20._4_4_ = fVar5 * *(float *)(this + 0x14);
      auVar20._8_4_ = fVar6 * *(float *)(this + 0x18);
      auVar20._12_4_ = fVar7 * *(float *)(this + 0x1c);
      auVar27._0_4_ = fVar4 * *(float *)(this + 0x20);
      auVar27._4_4_ = fVar5 * *(float *)(this + 0x24);
      auVar27._8_4_ = fVar6 * *(float *)(this + 0x28);
      auVar27._12_4_ = fVar7 * *(float *)(this + 0x2c);
      auVar16._0_4_ = fVar4 * *(float *)(this + 0x30);
      auVar16._4_4_ = fVar5 * *(float *)(this + 0x34);
      auVar16._8_4_ = fVar6 * *(float *)(this + 0x38);
      auVar16._12_4_ = fVar7 * *(float *)(this + 0x3c);
      auVar29._0_4_ = fVar4 * *(float *)(this + 0x40);
      auVar29._4_4_ = fVar5 * *(float *)(this + 0x44);
      auVar29._8_4_ = fVar6 * *(float *)(this + 0x48);
      auVar29._12_4_ = fVar7 * *(float *)(this + 0x4c);
      auVar22._0_4_ = fVar4 * *(float *)(this + 0x50);
      auVar22._4_4_ = fVar5 * *(float *)(this + 0x54);
      auVar22._8_4_ = fVar6 * *(float *)(this + 0x58);
      auVar22._12_4_ = fVar7 * *(float *)(this + 0x5c);
      auVar32._0_4_ = fVar4 * *(float *)(this + 0x60);
      auVar32._4_4_ = fVar5 * *(float *)(this + 100);
      auVar32._8_4_ = fVar6 * *(float *)(this + 0x68);
      auVar32._12_4_ = fVar7 * *(float *)(this + 0x6c);
      auVar9 = vandps_avx(auVar25,auVar8);
      auVar23 = vorps_avx(auVar9,auVar10);
      auVar9 = vandps_avx(auVar29,auVar8);
      auVar17 = vorps_avx(auVar9,auVar10);
      auVar9 = vandps_avx(auVar27,auVar8);
      auVar24 = vorps_avx(auVar9,auVar10);
      auVar9 = vandps_avx(auVar32,auVar8);
      auVar9 = vorps_avx(auVar9,auVar10);
      auVar26._0_4_ = (int)(auVar25._0_4_ + auVar23._0_4_);
      auVar26._4_4_ = (int)(auVar25._4_4_ + auVar23._4_4_);
      auVar26._8_4_ = (int)(auVar25._8_4_ + auVar23._8_4_);
      auVar26._12_4_ = (int)(auVar25._12_4_ + auVar23._12_4_);
      auVar30._0_4_ = (int)(auVar29._0_4_ + auVar17._0_4_);
      auVar30._4_4_ = (int)(auVar29._4_4_ + auVar17._4_4_);
      auVar30._8_4_ = (int)(auVar29._8_4_ + auVar17._8_4_);
      auVar30._12_4_ = (int)(auVar29._12_4_ + auVar17._12_4_);
      auVar23 = vpackssdw_avx(auVar26,auVar30);
      auVar31._0_4_ = fVar4 * *(float *)(this + 0x70);
      auVar31._4_4_ = fVar5 * *(float *)(this + 0x74);
      auVar31._8_4_ = fVar6 * *(float *)(this + 0x78);
      auVar31._12_4_ = fVar7 * *(float *)(this + 0x7c);
      auVar28._0_4_ = (int)(auVar27._0_4_ + auVar24._0_4_);
      auVar28._4_4_ = (int)(auVar27._4_4_ + auVar24._4_4_);
      auVar28._8_4_ = (int)(auVar27._8_4_ + auVar24._8_4_);
      auVar28._12_4_ = (int)(auVar27._12_4_ + auVar24._12_4_);
      auVar33._0_4_ = (int)(auVar32._0_4_ + auVar9._0_4_);
      auVar33._4_4_ = (int)(auVar32._4_4_ + auVar9._4_4_);
      auVar33._8_4_ = (int)(auVar32._8_4_ + auVar9._8_4_);
      auVar33._12_4_ = (int)(auVar32._12_4_ + auVar9._12_4_);
      auVar9 = vpackssdw_avx(auVar28,auVar33);
      auVar23 = vpminsw_avx(auVar23,auVar12);
      auVar17 = vpminsw_avx(auVar9,auVar12);
      auVar9 = vpmaxsw_avx(auVar23,auVar14);
      auVar23 = vpmaxsw_avx(auVar17,auVar14);
      auVar25 = vpacksswb_avx(auVar9,auVar23);
      auVar9 = vandps_avx(auVar20,auVar8);
      auVar23 = vorps_avx(auVar9,auVar10);
      auVar9 = vandps_avx(auVar22,auVar8);
      auVar17 = vorps_avx(auVar9,auVar10);
      auVar9 = vandps_avx(auVar16,auVar8);
      auVar24 = vorps_avx(auVar9,auVar10);
      auVar9 = vandps_avx(auVar31,auVar8);
      auVar9 = vorps_avx(auVar9,auVar10);
      auVar21._0_4_ = (int)(auVar23._0_4_ + auVar20._0_4_);
      auVar21._4_4_ = (int)(auVar23._4_4_ + auVar20._4_4_);
      auVar21._8_4_ = (int)(auVar23._8_4_ + auVar20._8_4_);
      auVar21._12_4_ = (int)(auVar23._12_4_ + auVar20._12_4_);
      auVar23._0_4_ = (int)(auVar17._0_4_ + auVar22._0_4_);
      auVar23._4_4_ = (int)(auVar17._4_4_ + auVar22._4_4_);
      auVar23._8_4_ = (int)(auVar17._8_4_ + auVar22._8_4_);
      auVar23._12_4_ = (int)(auVar17._12_4_ + auVar22._12_4_);
      auVar23 = vpackssdw_avx(auVar21,auVar23);
      auVar17._0_4_ = (int)(auVar24._0_4_ + auVar16._0_4_);
      auVar17._4_4_ = (int)(auVar24._4_4_ + auVar16._4_4_);
      auVar17._8_4_ = (int)(auVar24._8_4_ + auVar16._8_4_);
      auVar17._12_4_ = (int)(auVar24._12_4_ + auVar16._12_4_);
      auVar24._0_4_ = (int)(auVar31._0_4_ + auVar9._0_4_);
      auVar24._4_4_ = (int)(auVar31._4_4_ + auVar9._4_4_);
      auVar24._8_4_ = (int)(auVar31._8_4_ + auVar9._8_4_);
      auVar24._12_4_ = (int)(auVar31._12_4_ + auVar9._12_4_);
      auVar9 = vpackssdw_avx(auVar17,auVar24);
      auVar23 = vpminsw_avx(auVar23,auVar12);
      auVar17 = vpminsw_avx(auVar9,auVar12);
      auVar9 = vpmaxsw_avx(auVar23,auVar14);
      auVar23 = vpmaxsw_avx(auVar17,auVar14);
      auVar9 = vpacksswb_avx(auVar9,auVar23);
      auVar23 = vpunpcklbw_avx(auVar25,auVar9);
      auVar9 = vpunpckhbw_avx(auVar25,auVar9);
      auVar17 = vpunpcklwd_avx(auVar23,auVar9);
      auVar9 = vpunpckhwd_avx(auVar23,auVar9);
      auVar24 = vpunpckldq_avx(auVar17,auVar9);
      auVar23 = vpunpckhdq_avx(auVar17,auVar9);
      *(long *)ptr = auVar24._0_8_;
      auVar9 = vpshufd_avx(auVar24,0x4e);
      *(long *)s8ptr0 = auVar9._0_8_;
      *(long *)s8ptr1 = auVar23._0_8_;
      auVar9 = vpshufd_avx(auVar23,0x4e);
      *(long *)s8ptr2 = auVar9._0_8_;
      this = this + 0x80;
      ptr = ptr + 2;
      s8ptr0 = s8ptr0 + 8;
      s8ptr1 = s8ptr1 + 8;
      s8ptr2 = s8ptr2 + 8;
      iVar3 = iVar3 + 8;
    } while (iVar3 < elemcount);
  }
  if ((int)uVar1 < elemcount) {
    lVar2 = 0;
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar11._8_4_ = 0x3f000000;
    auVar11._0_8_ = 0x3f0000003f000000;
    auVar11._12_4_ = 0x3f000000;
    auVar13._8_4_ = 0x7f007f;
    auVar13._0_8_ = 0x7f007f007f007f;
    auVar13._12_4_ = 0x7f007f;
    auVar15._8_4_ = 0xff81ff81;
    auVar15._0_8_ = 0xff81ff81ff81ff81;
    auVar15._12_4_ = 0xff81ff81;
    do {
      auVar18._0_4_ = fVar4 * *(float *)this;
      auVar18._4_4_ = fVar5 * *(float *)(this + 4);
      auVar18._8_4_ = fVar6 * *(float *)(this + 8);
      auVar18._12_4_ = fVar7 * *(float *)(this + 0xc);
      auVar8 = vandps_avx(auVar18,auVar9);
      auVar8 = vorps_avx(auVar8,auVar11);
      auVar19._0_4_ = (int)(auVar18._0_4_ + auVar8._0_4_);
      auVar19._4_4_ = (int)(auVar18._4_4_ + auVar8._4_4_);
      auVar19._8_4_ = (int)(auVar18._8_4_ + auVar8._8_4_);
      auVar19._12_4_ = (int)(auVar18._12_4_ + auVar8._12_4_);
      auVar8 = vpackssdw_avx(auVar19,auVar19);
      auVar8 = vpminsw_avx(auVar8,auVar13);
      auVar8 = vpmaxsw_avx(auVar8,auVar15);
      auVar8 = vpacksswb_avx(auVar8,auVar8);
      *(char *)((long)ptr + lVar2) = auVar8[4];
      s8ptr0[lVar2] = auVar8[5];
      s8ptr1[lVar2] = auVar8[6];
      s8ptr2[lVar2] = auVar8[7];
      this = this + 0x10;
      lVar2 = lVar2 + 1;
    } while (elemcount - uVar1 != (int)lVar2);
  }
  return;
}

Assistant:

static void quantize_pack4to1(const float* ptr, signed char* s8ptr0, signed char* s8ptr1, signed char* s8ptr2, signed char* s8ptr3, const Mat& scale_data, int elemcount)
{
    const int scale_data_size = scale_data.w;

    // NCNN_LOGE("quantize_pack4to1 %d   %d", scale_data_size, elemcount);

    float scale = scale_data[0];
    __m128 _scale = _mm_set1_ps(scale);
    if (scale_data_size > 1)
    {
        _scale = _mm_loadu_ps((const float*)scale_data);
    }

    int i = 0;
    for (; i + 7 < elemcount; i += 8)
    {
        __m128 _v0 = _mm_loadu_ps(ptr);
        __m128 _v1 = _mm_loadu_ps(ptr + 4);
        __m128 _v2 = _mm_loadu_ps(ptr + 8);
        __m128 _v3 = _mm_loadu_ps(ptr + 12);
        __m128 _v4 = _mm_loadu_ps(ptr + 16);
        __m128 _v5 = _mm_loadu_ps(ptr + 20);
        __m128 _v6 = _mm_loadu_ps(ptr + 24);
        __m128 _v7 = _mm_loadu_ps(ptr + 28);
        _v0 = _mm_mul_ps(_v0, _scale);
        _v1 = _mm_mul_ps(_v1, _scale);
        _v2 = _mm_mul_ps(_v2, _scale);
        _v3 = _mm_mul_ps(_v3, _scale);
        _v4 = _mm_mul_ps(_v4, _scale);
        _v5 = _mm_mul_ps(_v5, _scale);
        _v6 = _mm_mul_ps(_v6, _scale);
        _v7 = _mm_mul_ps(_v7, _scale);
        __m128i v0426 = float2int8_sse(_v0, _v4, _v2, _v6);
        __m128i v1537 = float2int8_sse(_v1, _v5, _v3, _v7);
        __m128i v0145 = _mm_unpacklo_epi8(v0426, v1537);
        __m128i v2367 = _mm_unpackhi_epi8(v0426, v1537);
        __m128i v0123 = _mm_unpacklo_epi16(v0145, v2367);
        __m128i v4567 = _mm_unpackhi_epi16(v0145, v2367);
        __m128i v01 = _mm_unpacklo_epi32(v0123, v4567);
        __m128i v23 = _mm_unpackhi_epi32(v0123, v4567);
        _mm_storel_pd((double*)s8ptr0, _mm_castsi128_pd(v01));
        _mm_storeh_pd((double*)s8ptr1, _mm_castsi128_pd(v01));
        _mm_storel_pd((double*)s8ptr2, _mm_castsi128_pd(v23));
        _mm_storeh_pd((double*)s8ptr3, _mm_castsi128_pd(v23));
        ptr += 32;
        s8ptr0 += 8;
        s8ptr1 += 8;
        s8ptr2 += 8;
        s8ptr3 += 8;
    }
    for (; i < elemcount; i++)
    {
        __m128 _v = _mm_loadu_ps(ptr);
        _v = _mm_mul_ps(_v, _scale);
        int64_t v = float2int8_sse(_v, _v);
        s8ptr0[0] = (v >> 32) & 0xff;
        s8ptr1[0] = (v >> 40) & 0xff;
        s8ptr2[0] = (v >> 48) & 0xff;
        s8ptr3[0] = (v >> 56) & 0xff;
        ptr += 4;
        s8ptr0 += 1;
        s8ptr1 += 1;
        s8ptr2 += 1;
        s8ptr3 += 1;
    }
}